

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O0

void __thiscall
duckdb::AsOfProbeBuffer::ResolveJoin(AsOfProbeBuffer *this,bool *found_match,idx_t *matches)

{
  bool bVar1;
  int iVar2;
  idx_t iVar3;
  pointer pSVar4;
  idx_t iVar5;
  idx_t iVar6;
  __int_type _Var7;
  unsigned_long uVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  unsigned_long mid;
  unsigned_long last;
  idx_t first;
  idx_t begin;
  idx_t bound;
  idx_t i;
  idx_t left_base;
  idx_t count;
  PartitionGlobalHashGroup *in_stack_ffffffffffffff68;
  type in_stack_ffffffffffffff70;
  pointer in_stack_ffffffffffffff78;
  PartitionGlobalHashGroup *in_stack_ffffffffffffff80;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_30;
  
  *(undefined8 *)(in_RDI + 0x1a0) = 0;
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_> *)
                     0x17fe893);
  if (bVar1) {
    iVar3 = DataChunk::size((DataChunk *)(in_RDI + 0x90));
    pSVar4 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                         *)in_stack_ffffffffffffff70);
    SBIterator::GetIndex(pSVar4);
    for (local_30 = 0; local_30 < iVar3; local_30 = local_30 + 1) {
      unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                 in_stack_ffffffffffffff70);
      SBIterator::SetIndex((SBIterator *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78)
      ;
      unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                 in_stack_ffffffffffffff70);
      unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                 in_stack_ffffffffffffff70);
      bVar1 = SBIterator::Compare(in_stack_ffffffffffffff70,(SBIterator *)in_stack_ffffffffffffff68)
      ;
      if (bVar1) {
        local_38 = 1;
        pSVar4 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                             *)in_stack_ffffffffffffff70);
        iVar5 = SBIterator::GetIndex(pSVar4);
        unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                  ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                   in_stack_ffffffffffffff70);
        SBIterator::SetIndex
                  ((SBIterator *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
        while( true ) {
          pSVar4 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                               *)in_stack_ffffffffffffff70);
          iVar6 = SBIterator::GetIndex(pSVar4);
          optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->
                    ((optional_ptr<duckdb::PartitionGlobalHashGroup,_true> *)
                     in_stack_ffffffffffffff70);
          _Var7 = ::std::__atomic_base::operator_cast_to_unsigned_long
                            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
          if (_Var7 <= iVar6) break;
          unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      *)in_stack_ffffffffffffff70);
          unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      *)in_stack_ffffffffffffff70);
          bVar1 = SBIterator::Compare(in_stack_ffffffffffffff70,
                                      (SBIterator *)in_stack_ffffffffffffff68);
          if (!bVar1) break;
          local_38 = local_38 << 1;
          unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      *)in_stack_ffffffffffffff70);
          SBIterator::SetIndex
                    ((SBIterator *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
        }
        local_48 = iVar5 + (local_38 >> 1);
        in_stack_ffffffffffffff80 = (PartitionGlobalHashGroup *)(iVar5 + local_38);
        optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->
                  ((optional_ptr<duckdb::PartitionGlobalHashGroup,_true> *)in_stack_ffffffffffffff70
                  );
        _Var7 = ::std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff78);
        uVar8 = MinValue<unsigned_long>((unsigned_long)in_stack_ffffffffffffff80,_Var7);
        while (local_50 = uVar8, local_48 < local_50) {
          uVar8 = local_48 + (local_50 - local_48 >> 1);
          unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      *)in_stack_ffffffffffffff70);
          SBIterator::SetIndex
                    ((SBIterator *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff78 =
               unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
               operator->((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                           *)in_stack_ffffffffffffff70);
          unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                    ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      *)in_stack_ffffffffffffff70);
          bVar1 = SBIterator::Compare(in_stack_ffffffffffffff70,
                                      (SBIterator *)in_stack_ffffffffffffff68);
          if (bVar1) {
            local_48 = uVar8 + 1;
            uVar8 = local_50;
          }
        }
        unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator->
                  ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                   in_stack_ffffffffffffff70);
        SBIterator::SetIndex
                  ((SBIterator *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
        in_stack_ffffffffffffff68 =
             optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::operator->
                       ((optional_ptr<duckdb::PartitionGlobalHashGroup,_true> *)
                        in_stack_ffffffffffffff70);
        in_stack_ffffffffffffff70 =
             unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator*((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                        *)in_stack_ffffffffffffff70);
        unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::operator*
                  ((unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *)
                   in_stack_ffffffffffffff70);
        iVar2 = PartitionGlobalHashGroup::ComparePartitions
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
        if (iVar2 == 0) {
          if (in_RSI != 0) {
            *(undefined1 *)(in_RSI + local_30) = 1;
          }
          if (in_RDX != 0) {
            *(ulong *)(in_RDX + local_30 * 8) = local_48 - 1;
          }
          *(long *)(in_RDI + 0x1a0) = *(long *)(in_RDI + 0x1a0) + 1;
          SelectionVector::set_index
                    ((SelectionVector *)in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78,
                     (idx_t)in_stack_ffffffffffffff70);
        }
      }
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::ResolveJoin(bool *found_match, idx_t *matches) {
	// If there was no right partition, there are no matches
	lhs_match_count = 0;
	if (!right_itr) {
		return;
	}

	const auto count = lhs_payload.size();
	const auto left_base = left_itr->GetIndex();
	//	Searching for right <= left
	for (idx_t i = 0; i < count; ++i) {
		left_itr->SetIndex(left_base + i);

		//	If right > left, then there is no match
		if (!right_itr->Compare(*left_itr)) {
			continue;
		}

		// Exponential search forward for a non-matching value using radix iterators
		// (We use exponential search to avoid thrashing the block manager on large probes)
		idx_t bound = 1;
		idx_t begin = right_itr->GetIndex();
		right_itr->SetIndex(begin + bound);
		while (right_itr->GetIndex() < right_hash->count) {
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, jump ahead
				bound *= 2;
				right_itr->SetIndex(begin + bound);
			} else {
				break;
			}
		}

		//	Binary search for the first non-matching value using radix iterators
		//	The previous value (which we know exists) is the match
		auto first = begin + bound / 2;
		auto last = MinValue<idx_t>(begin + bound, right_hash->count);
		while (first < last) {
			const auto mid = first + (last - first) / 2;
			right_itr->SetIndex(mid);
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, new lower bound
				first = mid + 1;
			} else {
				last = mid;
			}
		}
		right_itr->SetIndex(--first);

		//	Check partitions for strict equality
		if (right_hash->ComparePartitions(*left_itr, *right_itr)) {
			continue;
		}

		// Emit match data
		if (found_match) {
			found_match[i] = true;
		}
		if (matches) {
			matches[i] = first;
		}
		lhs_sel.set_index(lhs_match_count++, i);
	}
}